

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_trace_file.c
# Opt level: O2

mFILE * find_file_url(char *file,char *url)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  hFILE *fp;
  mFILE *mf;
  ssize_t sVar6;
  size_t sVar7;
  ulong uVar8;
  char *__dest;
  char buf [8192];
  
  __dest = buf;
  sVar4 = strlen(file);
  while ((cVar1 = *url, cVar1 != '\0' && ((long)__dest - (long)buf < (long)(0x1ffe - (int)sVar4))))
  {
    if ((cVar1 == '%') && (url[1] == 's')) {
      url = url + 1;
      strcpy(__dest,file);
      sVar5 = strlen(__dest);
      __dest = __dest + sVar5;
    }
    else {
      *__dest = cVar1;
      __dest = __dest + 1;
    }
    url = url + 1;
  }
  *__dest = '\0';
  fp = hopen(buf,"r");
  if (fp != (hFILE *)0x0) {
    mf = mfcreate((char *)0x0,0);
    if (mf == (mFILE *)0x0) {
      return (mFILE *)0x0;
    }
    do {
      uVar8 = (long)fp->end - (long)fp->begin;
      sVar4 = 0x2000;
      if (uVar8 < 0x2000) {
        sVar4 = uVar8;
      }
      memcpy(buf,fp->begin,sVar4);
      fp->begin = fp->begin + sVar4;
      uVar2 = 0x2000;
      if (uVar8 < 0x2000) {
        sVar6 = hread2(fp,buf,0x2000,sVar4);
        uVar2 = (uint)sVar6;
        if ((int)uVar2 < 1) {
          iVar3 = hclose(fp);
          if (-1 < iVar3) {
            mrewind(mf);
            return mf;
          }
          goto LAB_001237b0;
        }
      }
      sVar7 = mfwrite(buf,(ulong)(uVar2 & 0x7fffffff),1,mf);
    } while (sVar7 != 0);
    hclose_abruptly(fp);
LAB_001237b0:
    mfdestroy(mf);
  }
  return (mFILE *)0x0;
}

Assistant:

mFILE *find_file_url(char *file, char *url) {
    char buf[8192], *cp;
    mFILE *mf = NULL;
    int maxlen = 8190 - strlen(file), len;
    hFILE *hf;

    /* Expand %s for the trace name */
    for (cp = buf; *url && cp - buf < maxlen; url++) {
	if (*url == '%' && *(url+1) == 's') {
	    url++;
	    cp += strlen(strcpy(cp, file));
	} else {
	    *cp++ = *url;
	}
    }
    *cp++ = 0;

    if (!(hf = hopen(buf, "r")))
	return NULL;

    if (NULL == (mf = mfcreate(NULL, 0)))
	return NULL;
    while ((len = hread(hf, buf, 8192)) > 0) {
	if (mfwrite(buf, len, 1, mf) <= 0) {
	    hclose_abruptly(hf);
	    mfdestroy(mf);
	    return NULL;
	}
    }
    if (hclose(hf) < 0) {
	mfdestroy(mf);
	return NULL;
    }

    mrewind(mf);
    return mf;
}